

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_SetStreamDesc(void *drvObj,char *streamDesc)

{
  char *pcVar1;
  DRV_PULSE *drv;
  char *streamDesc_local;
  void *drvObj_local;
  
  if (*(long *)((long)drvObj + 0x48) == 0) {
    free(*(void **)((long)drvObj + 0x58));
    pcVar1 = strdup(streamDesc);
    *(char **)((long)drvObj + 0x58) = pcVar1;
    drvObj_local._7_1_ = '\0';
  }
  else {
    drvObj_local._7_1_ = '\x18';
  }
  return drvObj_local._7_1_;
}

Assistant:

UINT8 Pulse_SetStreamDesc(void* drvObj, const char* streamDesc)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	
	//The Simple API does not accept updates to the stream description
	if (drv->hPulse)
		return AERR_WASDONE;
	
	free(drv->streamDesc);
	drv->streamDesc = strdup(streamDesc);
	
	return AERR_OK;
}